

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int time_isxmasday(void)

{
  int iVar1;
  tm *ptVar2;
  long in_FS_OFFSET;
  time_t time_data;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  time(&time_data);
  ptVar2 = localtime(&time_data);
  if ((ptVar2->tm_mon == 0xb) && (ptVar2->tm_mday - 0x18U < 3)) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int time_isxmasday()
{
	time_t time_data;
	struct tm *time_info;

	time(&time_data);
	time_info = localtime(&time_data);
	if(time_info->tm_mon == 11 && time_info->tm_mday >= 24 && time_info->tm_mday <= 26)
		return 1;
	return 0;
}